

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::forcingRow<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,
          HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,double side,RowType rowType)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  int __c;
  undefined8 in_RDX;
  int in_ESI;
  iterator *rhs;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_RDI;
  HighsDataStack *in_XMM0_Qa;
  HighsSliceNonzero *rowVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletPositionSlice> *__range2;
  HighsMatrixSlice<HighsTripletPositionSlice> *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *this_01;
  ForcingRow *in_stack_ffffffffffffff58;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff60;
  iterator local_70;
  iterator local_50;
  undefined8 local_30;
  HighsDataStack *local_20;
  undefined8 local_18;
  int local_c;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x72d027);
  local_30 = local_18;
  HighsMatrixSlice<HighsTripletPositionSlice>::begin(in_stack_ffffffffffffff50);
  HighsMatrixSlice<HighsTripletPositionSlice>::end(in_stack_ffffffffffffff50);
  while( true ) {
    rhs = &local_70;
    bVar1 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator!=(&local_50,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator*(&local_50);
    in_stack_ffffffffffffff58 = (ForcingRow *)(in_RDI + 7);
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 4);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff60 =
         (HighsPostsolveStack *)
         std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,(double *)this_01);
    HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator++(&local_50);
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_c);
  HighsDataStack::push<presolve::HighsPostsolveStack::ForcingRow,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(local_20,in_RDI);
  reductionAdded(in_stack_ffffffffffffff60,type);
  return;
}

Assistant:

void forcingRow(HighsInt row,
                  const HighsMatrixSlice<RowStorageFormat>& rowVec, double side,
                  RowType rowType) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(ForcingRow{side, origRowIndex[row], rowType});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kForcingRow);
  }